

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapathGen.cpp
# Opt level: O0

void datapathgenerator(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *b,datanode *node)

{
  int iVar1;
  int iVar2;
  datanode *pdVar3;
  bool bVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  float fVar9;
  string *local_e00;
  string *local_d88;
  string *local_d10;
  string *local_c98;
  string *local_c20;
  string *local_ba8;
  string *local_b28;
  string *local_ab0;
  string *local_a38;
  string *local_9c0;
  string *local_948;
  string *local_8d0;
  string local_888 [32];
  string local_868 [38];
  undefined1 local_842;
  allocator local_841;
  string *local_840;
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [38];
  undefined1 local_792;
  allocator local_791;
  string *local_790;
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [38];
  undefined1 local_6e2;
  allocator local_6e1;
  string *local_6e0;
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [38];
  undefined1 local_632;
  allocator local_631;
  string *local_630;
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string asStack_5c8 [15];
  allocator local_5b9;
  string local_5b8 [32];
  string local_598 [38];
  undefined1 local_572;
  allocator local_571;
  string *local_570;
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [38];
  undefined1 local_4e2;
  allocator local_4e1;
  string *local_4e0;
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [38];
  undefined1 local_412;
  allocator local_411;
  string *local_410;
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string *local_360;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [38];
  undefined1 local_2b2;
  allocator local_2b1;
  string *local_2b0;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string *local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [38];
  undefined1 local_152;
  allocator local_151;
  string *local_150;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string asStack_e8 [8];
  string local_e0 [32];
  string local_c0 [34];
  undefined1 local_9e;
  allocator local_9d [13];
  string *local_90;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string asStack_28 [8];
  int local_20;
  int local_1c;
  int dsize;
  int i;
  datanode *node_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *b_local;
  
  local_1c = 0;
  local_20 = nodepointer;
  _dsize = node;
  node_local = (datanode *)b;
  do {
    uVar5 = (ulong)local_1c;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)node_local);
    if (sVar6 <= uVar5) {
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<(poVar8,"Critical Delay : ");
      fVar9 = maxdelay(_dsize,local_20);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,fVar9);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      return;
    }
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)node_local,(long)local_1c);
    bVar4 = std::operator==(pvVar7,"=");
    if (bVar4) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)node_local,(long)(local_1c + 2));
      bVar4 = std::operator==(pvVar7,"+");
      if (bVar4) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)node_local,(long)(local_1c + 3));
        bVar4 = std::operator==(pvVar7,"1");
        if (bVar4) {
          local_9e = 1;
          local_90 = local_88;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 1));
          std::__cxx11::string::string(local_88,(string *)pvVar7);
          local_90 = local_68;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 3));
          std::__cxx11::string::string(local_68,(string *)pvVar7);
          local_90 = local_48;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_48,"",local_9d);
          local_9e = 0;
          std::allocator<char>::~allocator((allocator<char> *)local_9d);
          pdVar3 = _dsize;
          iVar2 = local_1c;
          iVar1 = local_20;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + -1));
          std::__cxx11::string::string(local_c0,(string *)pvVar7);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 2));
          std::__cxx11::string::string(local_e0,(string *)pvVar7);
          calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_88,(string *)local_c0,10,
                             (string *)local_e0);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_c0);
          local_1c = local_1c + 4;
          local_8d0 = asStack_28;
          do {
            local_8d0 = local_8d0 + -0x20;
            std::__cxx11::string::~string(local_8d0);
          } while (local_8d0 != local_88);
        }
        else {
          local_152 = 1;
          local_150 = local_148;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 1));
          std::__cxx11::string::string(local_148,(string *)pvVar7);
          local_150 = local_128;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 3));
          std::__cxx11::string::string(local_128,(string *)pvVar7);
          local_150 = local_108;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"",&local_151);
          local_152 = 0;
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
          pdVar3 = _dsize;
          iVar2 = local_1c;
          iVar1 = local_20;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + -1));
          std::__cxx11::string::string(local_178,(string *)pvVar7);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 2));
          std::__cxx11::string::string(local_198,(string *)pvVar7);
          calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_148,(string *)local_178,1,
                             (string *)local_198);
          std::__cxx11::string::~string(local_198);
          std::__cxx11::string::~string(local_178);
          local_1c = local_1c + 4;
          local_948 = asStack_e8;
          do {
            local_948 = local_948 + -0x20;
            std::__cxx11::string::~string(local_948);
          } while (local_948 != local_148);
        }
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)node_local,(long)(local_1c + 2));
        bVar4 = std::operator==(pvVar7,"-");
        if (bVar4) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 3));
          bVar4 = std::operator==(pvVar7,"1");
          if (bVar4) {
            local_202 = 1;
            local_200 = local_1f8;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 1));
            std::__cxx11::string::string(local_1f8,(string *)pvVar7);
            local_200 = local_1d8;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 3));
            std::__cxx11::string::string(local_1d8,(string *)pvVar7);
            local_200 = local_1b8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b8,"",&local_201);
            local_202 = 0;
            std::allocator<char>::~allocator((allocator<char> *)&local_201);
            pdVar3 = _dsize;
            iVar2 = local_1c;
            iVar1 = local_20;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + -1));
            std::__cxx11::string::string(local_228,(string *)pvVar7);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 2));
            std::__cxx11::string::string(local_248,(string *)pvVar7);
            calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_1f8,(string *)local_228,0xb,
                               (string *)local_248);
            std::__cxx11::string::~string(local_248);
            std::__cxx11::string::~string(local_228);
            local_1c = local_1c + 4;
            local_9c0 = local_198;
            do {
              local_9c0 = local_9c0 + -0x20;
              std::__cxx11::string::~string(local_9c0);
            } while (local_9c0 != local_1f8);
          }
          else {
            local_2b2 = 1;
            local_2b0 = local_2a8;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 1));
            std::__cxx11::string::string(local_2a8,(string *)pvVar7);
            local_2b0 = local_288;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 3));
            std::__cxx11::string::string(local_288,(string *)pvVar7);
            local_2b0 = local_268;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_268,"",&local_2b1);
            local_2b2 = 0;
            std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
            pdVar3 = _dsize;
            iVar2 = local_1c;
            iVar1 = local_20;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + -1));
            std::__cxx11::string::string(local_2d8,(string *)pvVar7);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 2));
            std::__cxx11::string::string(local_2f8,(string *)pvVar7);
            calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_2a8,(string *)local_2d8,2,
                               (string *)local_2f8);
            std::__cxx11::string::~string(local_2f8);
            std::__cxx11::string::~string(local_2d8);
            local_1c = local_1c + 4;
            local_a38 = local_248;
            do {
              local_a38 = local_a38 + -0x20;
              std::__cxx11::string::~string(local_a38);
            } while (local_a38 != local_2a8);
          }
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 2));
          bVar4 = std::operator==(pvVar7,">");
          if (!bVar4) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)node_local,(long)(local_1c + 2));
            bVar4 = std::operator==(pvVar7,"==");
            if (!bVar4) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)node_local,(long)(local_1c + 2));
              bVar4 = std::operator==(pvVar7,"<");
              if (!bVar4) {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)node_local,(long)(local_1c + 2));
                bVar4 = std::operator==(pvVar7,"*");
                if (bVar4) {
                  local_412 = 1;
                  local_410 = local_408;
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)node_local,(long)(local_1c + 1));
                  std::__cxx11::string::string(local_408,(string *)pvVar7);
                  local_410 = local_3e8;
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)node_local,(long)(local_1c + 3));
                  std::__cxx11::string::string(local_3e8,(string *)pvVar7);
                  local_410 = local_3c8;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_3c8,"",&local_411);
                  local_412 = 0;
                  std::allocator<char>::~allocator((allocator<char> *)&local_411);
                  pdVar3 = _dsize;
                  iVar2 = local_1c;
                  iVar1 = local_20;
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)node_local,(long)(local_1c + -1));
                  std::__cxx11::string::string(local_438,(string *)pvVar7);
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)node_local,(long)(local_1c + 2));
                  std::__cxx11::string::string(local_458,(string *)pvVar7);
                  calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_408,(string *)local_438,3,
                                     (string *)local_458);
                  std::__cxx11::string::~string(local_458);
                  std::__cxx11::string::~string(local_438);
                  local_1c = local_1c + 4;
                  local_b28 = local_3a8;
                  do {
                    local_b28 = local_b28 + -0x20;
                    std::__cxx11::string::~string(local_b28);
                  } while (local_b28 != local_408);
                }
                else {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)node_local,(long)(local_1c + 2));
                  bVar4 = std::operator==(pvVar7,"?");
                  if (bVar4) {
                    local_4e2 = 1;
                    local_4e0 = local_4d8;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 1));
                    std::__cxx11::string::string(local_4d8,(string *)pvVar7);
                    local_4e0 = local_4b8;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 3));
                    std::__cxx11::string::string(local_4b8,(string *)pvVar7);
                    local_4e0 = local_498;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 5));
                    std::__cxx11::string::string(local_498,(string *)pvVar7);
                    local_4e0 = local_478;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_478,"",&local_4e1);
                    local_4e2 = 0;
                    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
                    pdVar3 = _dsize;
                    iVar2 = local_1c;
                    iVar1 = local_20;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + -1));
                    std::__cxx11::string::string(local_508,(string *)pvVar7);
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 2));
                    std::__cxx11::string::string(local_528,(string *)pvVar7);
                    calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_4d8,(string *)local_508,5,
                                       (string *)local_528);
                    std::__cxx11::string::~string(local_528);
                    std::__cxx11::string::~string(local_508);
                    local_1c = local_1c + 4;
                    local_ba8 = local_458;
                    do {
                      local_ba8 = local_ba8 + -0x20;
                      std::__cxx11::string::~string(local_ba8);
                    } while (local_ba8 != local_4d8);
                  }
                  else {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 2));
                    bVar4 = std::operator==(pvVar7,"");
                    if (!bVar4) {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)node_local,(long)(local_1c + 3));
                      bVar4 = std::operator==(pvVar7,"=");
                      if (!bVar4) {
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)node_local,(long)(local_1c + 2));
                        bVar4 = std::operator==(pvVar7,"<<");
                        if (bVar4) {
                          local_632 = 1;
                          local_630 = local_628;
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)node_local,(long)(local_1c + 1));
                          std::__cxx11::string::string(local_628,(string *)pvVar7);
                          local_630 = local_608;
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)node_local,(long)(local_1c + 3));
                          std::__cxx11::string::string(local_608,(string *)pvVar7);
                          local_630 = local_5e8;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_5e8,"",&local_631);
                          local_632 = 0;
                          std::allocator<char>::~allocator((allocator<char> *)&local_631);
                          pdVar3 = _dsize;
                          iVar2 = local_1c;
                          iVar1 = local_20;
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)node_local,(long)(local_1c + -1));
                          std::__cxx11::string::string(local_658,(string *)pvVar7);
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)node_local,(long)(local_1c + 2));
                          std::__cxx11::string::string(local_678,(string *)pvVar7);
                          calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_628,
                                             (string *)local_658,7,(string *)local_678);
                          std::__cxx11::string::~string(local_678);
                          std::__cxx11::string::~string(local_658);
                          local_1c = local_1c + 2;
                          local_c98 = asStack_5c8;
                          do {
                            local_c98 = local_c98 + -0x20;
                            std::__cxx11::string::~string(local_c98);
                          } while (local_c98 != local_628);
                        }
                        else {
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)node_local,(long)(local_1c + 2));
                          bVar4 = std::operator==(pvVar7,">>");
                          if (bVar4) {
                            local_6e2 = 1;
                            local_6e0 = local_6d8;
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 1));
                            std::__cxx11::string::string(local_6d8,(string *)pvVar7);
                            local_6e0 = local_6b8;
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 3));
                            std::__cxx11::string::string(local_6b8,(string *)pvVar7);
                            local_6e0 = local_698;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_698,"",&local_6e1);
                            local_6e2 = 0;
                            std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
                            pdVar3 = _dsize;
                            iVar2 = local_1c;
                            iVar1 = local_20;
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + -1));
                            std::__cxx11::string::string(local_708,(string *)pvVar7);
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 2));
                            std::__cxx11::string::string(local_728,(string *)pvVar7);
                            calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_6d8,
                                               (string *)local_708,6,(string *)local_728);
                            std::__cxx11::string::~string(local_728);
                            std::__cxx11::string::~string(local_708);
                            local_1c = local_1c + 2;
                            local_d10 = local_678;
                            do {
                              local_d10 = local_d10 + -0x20;
                              std::__cxx11::string::~string(local_d10);
                            } while (local_d10 != local_6d8);
                          }
                          else {
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 2));
                            bVar4 = std::operator==(pvVar7,"/");
                            if (bVar4) {
                              local_792 = 1;
                              local_790 = local_788;
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 1));
                              std::__cxx11::string::string(local_788,(string *)pvVar7);
                              local_790 = local_768;
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 3));
                              std::__cxx11::string::string(local_768,(string *)pvVar7);
                              local_790 = local_748;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_748,"",&local_791);
                              local_792 = 0;
                              std::allocator<char>::~allocator((allocator<char> *)&local_791);
                              pdVar3 = _dsize;
                              iVar2 = local_1c;
                              iVar1 = local_20;
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + -1));
                              std::__cxx11::string::string(local_7b8,(string *)pvVar7);
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 2));
                              std::__cxx11::string::string(local_7d8,(string *)pvVar7);
                              calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_788,
                                                 (string *)local_7b8,8,(string *)local_7d8);
                              std::__cxx11::string::~string(local_7d8);
                              std::__cxx11::string::~string(local_7b8);
                              local_1c = local_1c + 2;
                              local_d88 = local_728;
                              do {
                                local_d88 = local_d88 + -0x20;
                                std::__cxx11::string::~string(local_d88);
                              } while (local_d88 != local_788);
                            }
                            else {
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 2));
                              bVar4 = std::operator==(pvVar7,"%");
                              if (bVar4) {
                                local_842 = 1;
                                local_840 = local_838;
                                pvVar7 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 1));
                                std::__cxx11::string::string(local_838,(string *)pvVar7);
                                local_840 = local_818;
                                pvVar7 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 3));
                                std::__cxx11::string::string(local_818,(string *)pvVar7);
                                local_840 = local_7f8;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_7f8,"",&local_841);
                                local_842 = 0;
                                std::allocator<char>::~allocator((allocator<char> *)&local_841);
                                pdVar3 = _dsize;
                                iVar2 = local_1c;
                                iVar1 = local_20;
                                pvVar7 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + -1));
                                std::__cxx11::string::string(local_868,(string *)pvVar7);
                                pvVar7 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)node_local,(long)(local_1c + 2));
                                std::__cxx11::string::string(local_888,(string *)pvVar7);
                                calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_838,
                                                   (string *)local_868,9,(string *)local_888);
                                std::__cxx11::string::~string(local_888);
                                std::__cxx11::string::~string(local_868);
                                local_1c = local_1c + 2;
                                local_e00 = local_7d8;
                                do {
                                  local_e00 = local_e00 + -0x20;
                                  std::__cxx11::string::~string(local_e00);
                                } while (local_e00 != local_838);
                              }
                            }
                          }
                        }
                        goto LAB_00113ecd;
                      }
                    }
                    local_572 = 1;
                    local_570 = local_568;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + 1));
                    std::__cxx11::string::string(local_568,(string *)pvVar7);
                    local_570 = local_548;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_548,"",&local_571);
                    local_572 = 0;
                    std::allocator<char>::~allocator((allocator<char> *)&local_571);
                    pdVar3 = _dsize;
                    iVar2 = local_1c;
                    iVar1 = local_20;
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)node_local,(long)(local_1c + -1));
                    std::__cxx11::string::string(local_598,(string *)pvVar7);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_5b8,"=",&local_5b9);
                    calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_568,(string *)local_598,0,
                                       (string *)local_5b8);
                    std::__cxx11::string::~string(local_5b8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                    std::__cxx11::string::~string(local_598);
                    local_1c = local_1c + 2;
                    local_c20 = local_528;
                    do {
                      local_c20 = local_c20 + -0x20;
                      std::__cxx11::string::~string(local_c20);
                    } while (local_c20 != local_568);
                  }
                }
                goto LAB_00113ecd;
              }
            }
          }
          local_362 = 1;
          local_360 = local_358;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 1));
          std::__cxx11::string::string(local_358,(string *)pvVar7);
          local_360 = local_338;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 3));
          std::__cxx11::string::string(local_338,(string *)pvVar7);
          local_360 = local_318;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_318,"",&local_361);
          local_362 = 0;
          std::allocator<char>::~allocator((allocator<char> *)&local_361);
          pdVar3 = _dsize;
          iVar2 = local_1c;
          iVar1 = local_20;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + -1));
          std::__cxx11::string::string(local_388,(string *)pvVar7);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)node_local,(long)(local_1c + 2));
          std::__cxx11::string::string(local_3a8,(string *)pvVar7);
          calculateDelayComp(pdVar3,iVar1,iVar2,(string *)local_358,(string *)local_388,4,
                             (string *)local_3a8);
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::string::~string(local_388);
          local_1c = local_1c + 4;
          local_ab0 = local_2f8;
          do {
            local_ab0 = local_ab0 + -0x20;
            std::__cxx11::string::~string(local_ab0);
          } while (local_ab0 != local_358);
        }
      }
    }
LAB_00113ecd:
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void datapathgenerator(vector<string> & b, struct datanode *node)
{
	int i = 0;
	int dsize = nodepointer;
	while (i < b.size()) {
		if (b[i] == "=")
		{
			if (b[i + 2] == "+")
			{
				if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 10,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 1,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == "-")
			{
					if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 11,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 2,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == ">" || (b[i + 2] == "==") || (b[i + 2] == "<"))
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 4,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "*")
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1],3,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "?")
			{
				string str[] = { b[i + 1],b[i + 3],b[i + 5],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 5,b[i+2]);
				i = i + 4;
			}

			else if (b[i + 2] == "\0" || b[i+3]=="=")
			{
				string str[] = { b[i + 1],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 0,"=");
				i = i + 2;
			}
			else if (b[i + 2] == "<<")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 7,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == ">>")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 6,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "/")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 8,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "%")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 9,b[i+2]);
				i = i + 2;
			}
		}
		i++;
	}
	//printNode(node, dsize);
	cout << endl << "Critical Delay : " << maxdelay(node,dsize)<<endl;
}